

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::Close(TCPSocket *this)

{
  Poller *pPVar1;
  bool bVar2;
  element_type *this_00;
  enable_shared_from_this<hwnet::TCPSocket> local_88;
  shared_ptr<hwnet::Task> local_78;
  enable_shared_from_this<hwnet::TCPSocket> local_68;
  shared_ptr<hwnet::Channel> local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<hwnet::util::Timer> sp;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  bool post;
  TCPSocket *this_local;
  
  guard._M_device._7_1_ = 0;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx);
  bVar2 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
  if (bVar2) {
    sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         1;
  }
  else {
    std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)local_38);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar2) {
      this_00 = std::
                __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
      util::Timer::cancel(this_00);
      std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_38);
    this->recvTimeout = 0;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              (&this->recvTimeoutCallback_,(nullptr_t)0x0);
    this->sendTimeout = 0;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              (&this->sendTimeoutCallback_,(nullptr_t)0x0);
    std::atomic<bool>::store(&this->closed,true,memory_order_seq_cst);
    shutdown(this->fd,2);
    pPVar1 = this->poller_;
    std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_68);
    std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPSocket,void>
              (local_58,(shared_ptr<hwnet::TCPSocket> *)&local_68);
    Poller::Remove(pPVar1,local_58);
    std::shared_ptr<hwnet::Channel>::~shared_ptr(local_58);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_68);
    bVar2 = std::function::operator_cast_to_bool((function *)&this->closeCallback_);
    if ((bVar2) && ((this->doing & 1U) == 0)) {
      guard._M_device._7_1_ = 1;
    }
    sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         0;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  if ((sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       == 0) && ((guard._M_device._7_1_ & 1) != 0)) {
    pPVar1 = this->poller_;
    std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_88);
    std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPSocket,void>
              (&local_78,(shared_ptr<hwnet::TCPSocket> *)&local_88);
    Poller::PostTask(pPVar1,&local_78,this->pool_);
    std::shared_ptr<hwnet::Task>::~shared_ptr(&local_78);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_88);
  }
  return;
}

Assistant:

void TCPSocket::Close() {
	
	auto post = false;
	{	
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this->closed) {
			return;
		}

		if(auto sp = this->timer.lock()) {
			sp->cancel();
			this->timer.reset();
		}

		this->recvTimeout = 0;
		this->recvTimeoutCallback_ = nullptr;

		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;


		this->closed.store(true);
		::shutdown(this->fd,SHUT_RDWR);
		poller_->Remove(shared_from_this());	

		if(this->closeCallback_ && !this->doing){
			post = true;
		}
	}
	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}	
}